

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void (anonymous_namespace)::
     time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
               (_func_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *f,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,int n,
               string *label)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  timer t;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> res;
  undefined8 local_58;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  local_58 = std::chrono::_V2::system_clock::now();
  iVar2 = 0;
  if (0 < n) {
    iVar2 = n;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    (*f)(&local_50,arg);
    std::__cxx11::u16string::~u16string((u16string *)&local_50);
  }
  timer::elapsed<std::chrono::duration<long,std::ratio<1l,1000l>>>((timer *)&local_58);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)label);
  poVar1 = std::operator<<(poVar1," took ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"ms\n");
  return;
}

Assistant:

void time_function_call(Func f, const Arg& arg, int n, const string& label)
{
    timer t;
    for (int i = 0; i < n; i++) {
        volatile auto res = f(arg);
    }
    auto e = t.elapsed();
    std::cout << label << " took " << e.count() << "ms\n";
}